

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_parsednumber.cpp
# Opt level: O2

void __thiscall icu_63::numparse::impl::ParsedNumber::ParsedNumber(ParsedNumber *this)

{
  icu_63::number::impl::DecimalQuantity::DecimalQuantity(&this->quantity);
  (this->prefix).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00471e80;
  (this->prefix).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->suffix).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00471e80;
  (this->suffix).fUnion.fStackFields.fLengthAndFlags = 2;
  clear(this);
  return;
}

Assistant:

ParsedNumber::ParsedNumber() {
    clear();
}